

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

void PaUtil_GroupFreeMemory(PaUtilAllocationGroup *group,void *buffer)

{
  PaUtilAllocationGroupLink *local_28;
  PaUtilAllocationGroupLink *previous;
  PaUtilAllocationGroupLink *current;
  void *buffer_local;
  PaUtilAllocationGroup *group_local;
  
  previous = group->allocations;
  local_28 = (PaUtilAllocationGroupLink *)0x0;
  if (buffer != (void *)0x0) {
    for (; previous != (PaUtilAllocationGroupLink *)0x0; previous = previous->next) {
      if (previous->buffer == buffer) {
        if (local_28 == (PaUtilAllocationGroupLink *)0x0) {
          group->allocations = previous->next;
        }
        else {
          local_28->next = previous->next;
        }
        previous->buffer = (void *)0x0;
        previous->next = group->spareLinks;
        group->spareLinks = previous;
        break;
      }
      local_28 = previous;
    }
    PaUtil_FreeMemory(buffer);
  }
  return;
}

Assistant:

void PaUtil_GroupFreeMemory( PaUtilAllocationGroup* group, void *buffer )
{
    struct PaUtilAllocationGroupLink *current = group->allocations;
    struct PaUtilAllocationGroupLink *previous = 0;

    if( buffer == 0 )
        return;

    /* find the right link and remove it */
    while( current )
    {
        if( current->buffer == buffer )
        {
            if( previous )
            {
                previous->next = current->next;
            }
            else
            {
                group->allocations = current->next;
            }

            current->buffer = 0;
            current->next = group->spareLinks;
            group->spareLinks = current;

            break;
        }
        
        previous = current;
        current = current->next;
    }

    PaUtil_FreeMemory( buffer ); /* free the memory whether we found it in the list or not */
}